

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QPixmapStyleDescriptor * __thiscall
QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
          (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *this,
          ControlDescriptor *key)

{
  QPixmapStyleDescriptor *pQVar1;
  QPixmapStyleDescriptor *in_RDI;
  QPixmapStyleDescriptor *v;
  QPixmapStyleDescriptor *in_stack_ffffffffffffffc8;
  QPixmapStyleDescriptor *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<QPixmapStyle::ControlDescriptor>
                     ((QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)in_RDI,
                      (ControlDescriptor *)in_RDI);
  if (pQVar1 == (QPixmapStyleDescriptor *)0x0) {
    memset(in_RDI,0,0x38);
    QPixmapStyleDescriptor::QPixmapStyleDescriptor(in_RDI);
  }
  else {
    QPixmapStyleDescriptor::QPixmapStyleDescriptor(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }